

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

SQInteger __thiscall SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr)

{
  SQLineInfo *pSVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  SQInteger *pSVar7;
  long lVar8;
  long lVar9;
  
  lVar6 = (long)curr + (-0xe0 - (long)this) >> 3;
  pSVar1 = this->_lineinfos;
  lVar3 = this->_nlineinfos + -1;
  lVar9 = 0;
  uVar2 = 0;
  lVar8 = lVar3;
  while (lVar9 <= lVar8) {
    uVar2 = (lVar8 - lVar9 >> 1) + lVar9;
    if (lVar6 < pSVar1[uVar2]._op) {
      lVar8 = uVar2 - 1;
    }
    else {
      if ((lVar6 <= pSVar1[uVar2]._op) ||
         (((long)uVar2 < lVar3 && (lVar6 <= pSVar1[uVar2 + 1]._op)))) break;
      lVar9 = uVar2 + 1;
    }
  }
  uVar4 = (long)uVar2 >> 0x3f & uVar2;
  for (pSVar7 = &pSVar1[uVar2]._op;
      (uVar5 = uVar4, 0 < (long)uVar2 && (uVar5 = uVar2, lVar6 <= *pSVar7)); pSVar7 = pSVar7 + -2) {
    uVar2 = uVar2 - 1;
  }
  return pSVar1[uVar5]._line;
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr)
{
    SQInteger op = (SQInteger)(curr-_instructions);
    SQInteger line=_lineinfos[0]._line;
    SQInteger low = 0;
    SQInteger high = _nlineinfos - 1;
    SQInteger mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        SQInteger curop = _lineinfos[mid]._op;
        if(curop > op)
        {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    return line;
}